

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void splitInterleavedSamples
               (uint8_t *inBufInterleaved,vector<float_*,_std::allocator<float_*>_> *inChannelBufs,
               int channels,int samples,int bytesPerSample)

{
  reference ppfVar1;
  int local_3c;
  int local_38;
  int b_1;
  int b;
  uint32_t uSample;
  int c;
  int i;
  uint32_t signBit;
  int bytesPerSample_local;
  int samples_local;
  int channels_local;
  vector<float_*,_std::allocator<float_*>_> *inChannelBufs_local;
  uint8_t *inBufInterleaved_local;
  
  for (uSample = 0; (int)uSample < samples; uSample = uSample + 1) {
    for (b = 0; b < channels; b = b + 1) {
      b_1 = 0;
      for (local_38 = 0; local_38 < bytesPerSample; local_38 = local_38 + 1) {
        b_1 = (uint)inBufInterleaved
                    [(int)(uSample * channels * bytesPerSample + b * bytesPerSample + local_38)] <<
              ((byte)(local_38 << 3) & 0x1f) | b_1;
      }
      local_3c = bytesPerSample;
      if ((b_1 & 0x80 << (((char)bytesPerSample + -1) * '\b' & 0x1fU)) != 0) {
        for (; local_3c < 4; local_3c = local_3c + 1) {
          b_1 = 0xff << ((byte)(local_3c << 3) & 0x1f) | b_1;
        }
      }
      ppfVar1 = std::vector<float_*,_std::allocator<float_*>_>::operator[](inChannelBufs,(long)b);
      (*ppfVar1)[(int)uSample] = (float)b_1;
    }
  }
  return;
}

Assistant:

void splitInterleavedSamples(uint8_t *inBufInterleaved, std::vector<float*> inChannelBufs, int channels, int samples, int bytesPerSample){
	uint32_t signBit = 0x80 << ((bytesPerSample-1) * 8);
	for(int i = 0; i < samples; i++){
		for(int c = 0; c < channels; c++){
			uint32_t uSample = 0;
			for(int b = 0; b < bytesPerSample; b++){
				uSample |= ((uint32_t)inBufInterleaved[i * channels * bytesPerSample + c * bytesPerSample + b]) << (8 * b);
			}
			if(uSample & signBit){ // sign extend
				for(int b = bytesPerSample; b < 4; b++){
					uSample |= 0xff << (b * 8);
				}
			}
			inChannelBufs[c][i] = (float)(int32_t)uSample;
		}
	}
}